

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1491_avgSalary.cpp
# Opt level: O2

int main(void)

{
  double dVar1;
  initializer_list<int> __l;
  allocator_type local_31;
  vector<int,_std::allocator<int>_> salary;
  int local_18 [4];
  
  local_18[0] = 1000;
  local_18[1] = 2000;
  local_18[2] = 3000;
  local_18[3] = 4000;
  __l._M_len = 4;
  __l._M_array = local_18;
  std::vector<int,_std::allocator<int>_>::vector(&salary,__l,&local_31);
  dVar1 = average(&salary);
  std::ostream::_M_insert<double>(dVar1);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&salary.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int main()
{
	vector<int> salary = {1000,2000,3000,4000};
	cout<<average(salary);
	return 0;
}